

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,REF_INT *to_part)

{
  REF_MPI pRVar1;
  REF_GRID pRVar2;
  REF_NODE ref_node;
  REF_NODE pRVar3;
  REF_DBL *pRVar4;
  int *piVar5;
  REF_CELL pRVar6;
  uint uVar7;
  REF_INT *vector;
  ulong uVar8;
  void *pvVar9;
  REF_CELL *ppRVar10;
  long lVar11;
  undefined8 uVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  size_t sVar22;
  REF_INT *local;
  REF_INT n_donor;
  int local_1c4;
  REF_MPI local_1c0;
  uint local_1b4;
  REF_NODE local_1b0;
  REF_CELL *local_1a8;
  REF_CELL *local_1a0;
  REF_CELL local_198;
  REF_INT *find_donation;
  REF_INT n_find;
  REF_INT *local_180;
  REF_GRID local_178;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_INT *find_ret;
  REF_INT *local_158;
  void *local_150;
  void *local_148;
  REF_NODE local_140;
  void *local_138;
  REF_GLOB *local_130;
  REF_DBL *local_128;
  REF_DBL *recept_bary;
  REF_GLOB *recept_global;
  REF_INT *recept_cell;
  REF_INT *recept_part;
  REF_INT n_lookedup;
  REF_INT cell_node;
  void *local_f8;
  REF_INT *local_f0;
  REF_INT *local_e8;
  REF_INT *lookedup_cell;
  REF_INT *lookedup_donation;
  REF_GLOB *find_nodes;
  REF_DBL *donor_bary;
  REF_GLOB *donor_global;
  REF_MPI local_b8;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_interp->ref_mpi;
  local_178 = ref_interp->from_grid;
  pRVar2 = ref_interp->to_grid;
  ref_node = pRVar2->node;
  pRVar3 = local_178->node;
  local_198 = (&ref_interp->from_tet)[local_178->twod != 0];
  if ((ref_interp->max < ref_node->max) &&
     (uVar7 = ref_interp_resize(ref_interp,ref_node->max), uVar7 != 0)) {
    uVar21 = (ulong)uVar7;
    pcVar16 = "resize";
    uVar12 = 0xad3;
  }
  else {
    uVar21 = (ulong)pRVar3->max;
    local_b0 = pRVar2;
    if ((long)uVar21 < 0) {
      pcVar16 = "malloc from_part of REF_INT negative";
      uVar12 = 0xad6;
      goto LAB_0016f4fa;
    }
    local_1b0 = pRVar3;
    local_e8 = to_part;
    vector = (REF_INT *)malloc(uVar21 * 4);
    if (vector == (REF_INT *)0x0) {
      pcVar16 = "malloc from_part of REF_INT NULL";
      uVar12 = 0xad6;
      goto LAB_0016f622;
    }
    for (uVar8 = 0; uVar8 < uVar21; uVar8 = uVar8 + 1) {
      vector[uVar8] = -1;
    }
    uVar7 = ref_node->max;
    uVar21 = 0;
    uVar8 = 0;
    if (0 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    uVar19 = 0;
    for (; uVar8 != uVar21; uVar21 = uVar21 + 1) {
      if (((-1 < ref_node->global[uVar21]) && (ref_node->ref_mpi->id == ref_node->part[uVar21])) &&
         (ref_interp->cell[uVar21] != -1)) {
        uVar19 = uVar19 + 1;
        local_1b4 = uVar19;
      }
    }
    local_1c0 = pRVar1;
    if ((int)uVar19 < 0) {
      pcVar16 = "malloc recept_bary of REF_DBL negative";
      uVar12 = 0xadf;
      goto LAB_0016f4fa;
    }
    local_1a8 = &ref_interp->from_tet;
    local_1a0 = &ref_interp->from_tri;
    recept_bary = (REF_DBL *)malloc((ulong)(uVar19 * 4) << 3);
    if (recept_bary == (REF_DBL *)0x0) {
      pcVar16 = "malloc recept_bary of REF_DBL NULL";
      uVar12 = 0xadf;
      goto LAB_0016f622;
    }
    sVar22 = (ulong)uVar19 * 4;
    local_128 = recept_bary;
    recept_cell = (REF_INT *)malloc(sVar22);
    if (recept_cell == (REF_INT *)0x0) {
      pcVar16 = "malloc recept_cell of REF_INT NULL";
      uVar12 = 0xae0;
      goto LAB_0016f622;
    }
    local_f0 = recept_cell;
    recept_global = (REF_GLOB *)malloc((ulong)uVar19 << 3);
    if (recept_global == (REF_GLOB *)0x0) {
      pcVar16 = "malloc recept_global of REF_GLOB NULL";
      uVar12 = 0xae1;
      goto LAB_0016f622;
    }
    local_130 = recept_global;
    pvVar9 = malloc(sVar22);
    if (pvVar9 == (void *)0x0) {
      pcVar16 = "malloc recept_ret of REF_INT NULL";
      uVar12 = 0xae2;
      goto LAB_0016f622;
    }
    recept_part = (REF_INT *)malloc(sVar22);
    pRVar1 = local_1c0;
    if (recept_part == (REF_INT *)0x0) {
      pcVar16 = "malloc recept_part of REF_INT NULL";
      uVar12 = 0xae3;
      goto LAB_0016f622;
    }
    local_1b4 = 0;
    lVar18 = 0;
    uVar19 = 0;
    for (lVar11 = 0; local_1c4 = (int)lVar11, lVar11 < (int)uVar7; lVar11 = lVar11 + 1) {
      lVar13 = ref_node->global[lVar11];
      if (((-1 < lVar13) && (ref_node->ref_mpi->id == ref_node->part[lVar11])) &&
         (iVar20 = ref_interp->cell[lVar11], iVar20 != -1)) {
        pRVar4 = ref_interp->bary;
        for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
          local_128[(int)(uVar19 * 4) + lVar17] = *(REF_DBL *)((long)pRVar4 + lVar17 * 8 + lVar18);
        }
        lVar17 = (long)(int)uVar19;
        local_f0[lVar17] = iVar20;
        local_130[lVar17] = lVar13;
        recept_part[lVar17] = ref_interp->part[lVar11];
        *(REF_INT *)((long)pvVar9 + lVar17 * 4) = local_e8[lVar11];
        uVar19 = uVar19 + 1;
        local_1b4 = uVar19;
      }
      lVar18 = lVar18 + 0x20;
    }
    local_158 = recept_part;
    local_f8 = pvVar9;
    uVar7 = ref_mpi_blindsend(local_1c0,recept_part,local_f0,1,uVar19,&donor_cell,&n_donor,1);
    if (uVar7 == 0) {
      uVar7 = ref_mpi_blindsend(pRVar1,local_158,local_f8,1,uVar19,&donor_ret,&n_donor,1);
      if (uVar7 == 0) {
        uVar7 = ref_mpi_blindsend(pRVar1,local_158,local_130,1,uVar19,&donor_global,&n_donor,2);
        if (uVar7 != 0) {
          pcVar16 = "blind send global";
          uVar12 = 0xafc;
          uVar21 = (ulong)uVar7;
          goto LAB_0016f25b;
        }
        uVar7 = ref_mpi_blindsend(pRVar1,local_158,local_128,4,uVar19,&donor_bary,&n_donor,3);
        if (uVar7 != 0) {
          pcVar16 = "blind send bary";
          uVar12 = 0xaff;
          goto LAB_0016f74f;
        }
        uVar21 = (ulong)n_donor;
        if ((long)uVar21 < 0) {
          pcVar16 = "malloc donor_nodes of REF_GLOB negative";
          uVar12 = 0xb01;
          goto LAB_0016f4fa;
        }
        uVar7 = n_donor * 4;
        pvVar9 = malloc((ulong)uVar7 * 8);
        if (pvVar9 == (void *)0x0) {
          pcVar16 = "malloc donor_nodes of REF_GLOB NULL";
          uVar12 = 0xb01;
          goto LAB_0016f622;
        }
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          *(undefined8 *)((long)pvVar9 + uVar8 * 8) = 0xffffffffffffffff;
        }
        sVar22 = uVar21 << 2;
        local_138 = malloc(sVar22);
        if (local_138 == (void *)0x0) {
          pcVar16 = "malloc donor_donation of REF_INT NULL";
          uVar12 = 0xb02;
          goto LAB_0016f622;
        }
        local_148 = pvVar9;
        local_180 = (REF_INT *)malloc(sVar22);
        if (local_180 == (REF_INT *)0x0) {
          pcVar16 = "malloc donor_part of REF_INT NULL";
          uVar12 = 0xb03;
          goto LAB_0016f622;
        }
        local_150 = malloc(sVar22);
        if (local_150 == (void *)0x0) {
          pcVar16 = "malloc donor_origpart of REF_INT NULL";
          uVar12 = 0xb04;
          goto LAB_0016f622;
        }
        for (lVar11 = 0; pRVar6 = local_198, lVar11 < (int)uVar21; lVar11 = lVar11 + 1) {
          uVar7 = ref_cell_nodes(local_198,donor_cell[lVar11],nodes);
          if (uVar7 != 0) {
            uVar21 = (ulong)uVar7;
            pcVar16 = "node needs to be localized";
            uVar12 = 0xb08;
            goto LAB_0016f258;
          }
          iVar20 = pRVar6->node_per;
          for (lVar18 = 0; lVar18 < iVar20; lVar18 = lVar18 + 1) {
            vector[nodes[lVar18]] = donor_ret[lVar11];
          }
          uVar21 = (ulong)(uint)n_donor;
        }
        uVar7 = ref_node_ghost_int(local_1b0,vector,1);
        if (uVar7 == 0) {
          local_b8 = ref_interp->ref_mpi;
          local_140 = ref_interp->from_grid->node;
          uVar7 = ref_edge_create((REF_EDGE *)&find_ret,ref_interp->from_grid);
          if (uVar7 == 0) {
            find_donation._0_4_ = 1;
            iVar20 = 0;
            do {
              if ((uint)find_donation == 0) {
                uVar7 = ref_edge_free((REF_EDGE)find_ret);
                if (uVar7 == 0) {
                  lVar11 = -1;
                  lVar18 = 0;
                  goto LAB_0016fc16;
                }
                uVar21 = (ulong)uVar7;
                pcVar16 = "ref_edge free";
                uVar12 = 0xaa7;
                goto LAB_0016f9c8;
              }
              find_donation._0_4_ = 0;
              uVar7 = 0;
              for (lVar11 = 0; lVar11 < local_140->max; lVar11 = lVar11 + 1) {
                if (((-1 < local_140->global[lVar11]) &&
                    (local_140->ref_mpi->id == local_140->part[lVar11])) && (vector[lVar11] == -1))
                {
                  piVar5 = *(int **)(find_ret + 4);
                  uVar21 = 0xffffffff;
                  iVar15 = -1;
                  if (lVar11 < *piVar5) {
                    uVar19 = *(uint *)(*(long *)(piVar5 + 2) + lVar11 * 4);
                    uVar21 = 0xffffffff;
                    iVar15 = -1;
                    if ((long)(int)uVar19 != -1) {
                      iVar15 = *(int *)(*(long *)(piVar5 + 4) + 4 + (long)(int)uVar19 * 8);
                      uVar21 = (ulong)uVar19;
                    }
                  }
                  while (iVar14 = (int)uVar21, iVar14 != -1) {
                    if (vector[(*(int *)(*(long *)(find_ret + 2) + (long)(iVar15 * 2) * 4) -
                               (int)lVar11) +
                               *(int *)(*(long *)(find_ret + 2) + (long)(iVar15 * 2 + 1) * 4)] != -1
                       ) {
                      vector[lVar11] =
                           vector[(*(int *)(*(long *)(find_ret + 2) + (long)(iVar15 * 2) * 4) -
                                  (int)lVar11) +
                                  *(int *)(*(long *)(find_ret + 2) + (long)(iVar15 * 2 + 1) * 4)];
                      break;
                    }
                    uVar21 = (ulong)*(int *)(*(long *)(piVar5 + 4) + (long)iVar14 * 8);
                    iVar15 = -1;
                    if (uVar21 != 0xffffffffffffffff) {
                      iVar15 = *(int *)(*(long *)(piVar5 + 4) + 4 + uVar21 * 8);
                    }
                  }
                  uVar7 = (uint)(uVar7 != 0 || iVar14 == -1);
                  find_donation._0_4_ = uVar7;
                }
              }
              uVar7 = ref_mpi_all_or(local_b8,(REF_BOOL *)&find_donation);
              if (uVar7 != 0) {
                uVar21 = (ulong)uVar7;
                pcVar16 = "mpi all or";
                uVar12 = 0xaa1;
                goto LAB_0016f9c8;
              }
              uVar7 = ref_node_ghost_int(local_140,vector,1);
              if (uVar7 != 0) {
                uVar21 = (ulong)uVar7;
                pcVar16 = "ghost from_part";
                uVar12 = 0xaa2;
                goto LAB_0016f9c8;
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 != 200);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0xaa4,"ref_interp_fill_empty_from_part","too many sweeps, stop inf loop");
            uVar21 = 1;
          }
          else {
            uVar21 = (ulong)uVar7;
            pcVar16 = "edges";
            uVar12 = 0xa94;
LAB_0016f9c8:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar12,"ref_interp_fill_empty_from_part",uVar21,pcVar16);
          }
          pcVar16 = "fill part";
          uVar12 = 0xb10;
        }
        else {
          uVar21 = (ulong)uVar7;
          pcVar16 = "ghost from_part";
          uVar12 = 0xb0d;
        }
      }
      else {
        uVar21 = (ulong)uVar7;
        pcVar16 = "blind send ret";
        uVar12 = 0xaf8;
      }
    }
    else {
      uVar21 = (ulong)uVar7;
      pcVar16 = "blind send cell";
      uVar12 = 0xaf5;
    }
  }
  goto LAB_0016f258;
LAB_0016fc16:
  if (n_donor <= lVar18) goto LAB_0016fd17;
  uVar7 = ref_cell_nodes(local_198,donor_cell[lVar18],nodes);
  if (uVar7 != 0) {
    uVar21 = (ulong)uVar7;
    pcVar16 = "node needs to be localized";
    uVar12 = 0xb16;
    goto LAB_0016f258;
  }
  uVar21 = (ulong)(uint)local_198->node_per;
  if (local_198->node_per < 1) {
    uVar21 = 0;
  }
  for (uVar8 = 0; uVar21 != uVar8; uVar8 = uVar8 + 1) {
    iVar20 = nodes[uVar8];
    lVar13 = lVar11;
    if (((-1 < (long)iVar20) && (iVar20 < local_1b0->max)) &&
       (lVar13 = local_1b0->global[iVar20], local_1b0->global[iVar20] < 0)) {
      lVar13 = lVar11;
    }
    *(long *)((long)local_148 + uVar8 * 8 + (ulong)((uint)lVar18 & 0x3fffffff) * 0x20) = lVar13;
  }
  *(uint *)((long)local_138 + lVar18 * 4) = (uint)lVar18;
  uVar7 = ref_cell_part_cell_node(local_198,local_1b0,donor_cell[lVar18],&cell_node);
  if (uVar7 != 0) {
    uVar21 = (ulong)uVar7;
    pcVar16 = "part cell_node";
    uVar12 = 0xb1d;
    goto LAB_0016f258;
  }
  local_180[lVar18] = vector[nodes[cell_node]];
  *(REF_INT *)((long)local_150 + lVar18 * 4) = local_1c0->id;
  lVar18 = lVar18 + 1;
  goto LAB_0016fc16;
code_r0x00170022:
  local_178 = (REF_GRID)((ulong)((uint)local_1a0 & 0x3fffffff) << 5);
  local = nodes;
  lVar11 = 0;
  while (ppRVar10 = local_1a0, lVar11 < local_198->node_per) {
    uVar7 = ref_node_local(local_1b0,*(REF_GLOB *)((long)find_nodes + (long)local_178 + lVar11 * 8),
                           local);
    lVar11 = lVar11 + 1;
    local = local + 1;
    if (uVar7 != 0) {
      uVar21 = (ulong)uVar7;
      pcVar16 = "g2l";
      uVar12 = 0xb4d;
      goto LAB_0016f258;
    }
  }
  uVar7 = ref_cell_with(local_198,nodes,(REF_INT *)((long)local_1a8 + (long)local_1a0 * 4));
  local_1a0 = (REF_CELL *)((long)ppRVar10 + 1);
  if (uVar7 != 0) goto code_r0x001700a9;
  goto LAB_00170012;
code_r0x001700a9:
  uVar21 = (ulong)uVar7;
  pcVar16 = "find cell with nodes";
  uVar12 = 0xb50;
  goto LAB_0016f258;
LAB_0016fd17:
  iVar20 = local_1b0->max;
  for (lVar11 = 0; lVar11 < iVar20; lVar11 = lVar11 + 1) {
    if ((-1 < local_1b0->global[lVar11]) && (vector[lVar11] == -1)) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0xb24,"ref_interp_from_part","from_part not set for node");
      return 1;
    }
  }
  local_1c4 = (int)lVar11;
  for (lVar11 = 0; (int)lVar11 < iVar20; lVar11 = lVar11 + 1) {
    local_1b0->part[lVar11] = vector[lVar11];
    iVar20 = local_1b0->max;
  }
  uVar7 = ref_migrate_shufflin(local_178);
  ppRVar10 = local_1a0;
  if (uVar7 == 0) {
    if (ref_interp->from_cell_freeable == 0) {
LAB_0016fed7:
      uVar7 = ref_mpi_blindsend(local_1c0,local_180,local_148,4,n_donor,&find_nodes,&n_find,2);
      if (uVar7 == 0) {
        uVar7 = ref_mpi_blindsend(local_1c0,local_180,local_138,1,n_donor,&find_donation,&n_find,1);
        if (uVar7 == 0) {
          uVar7 = ref_mpi_blindsend(local_1c0,local_180,local_150,1,n_donor,&find_ret,&n_find,1);
          if (uVar7 != 0) {
            pcVar16 = "blind send cell";
            uVar12 = 0xb46;
LAB_0016f74f:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar12,"ref_interp_from_part",(ulong)uVar7,pcVar16);
            return uVar7;
          }
          if ((long)n_find < 0) {
            pcVar16 = "malloc find_cell of REF_INT negative";
            uVar12 = 0xb48;
LAB_0016f4fa:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar12,"ref_interp_from_part",pcVar16);
            return 1;
          }
          local_1a8 = (REF_CELL *)malloc((long)n_find << 2);
          if (local_1a8 == (REF_CELL *)0x0) {
            pcVar16 = "malloc find_cell of REF_INT NULL";
            uVar12 = 0xb48;
            local_1a8 = (REF_CELL *)0x0;
LAB_0016f622:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,uVar12,"ref_interp_from_part",pcVar16);
            return 2;
          }
          local_1a0 = (REF_CELL *)0x0;
LAB_00170012:
          if ((long)local_1a0 < (long)n_find) goto code_r0x00170022;
          uVar7 = ref_mpi_blindsend(local_1c0,find_ret,local_1a8,1,n_find,&lookedup_cell,&n_lookedup
                                    ,1);
          if (uVar7 != 0) {
            uVar21 = (ulong)uVar7;
            pcVar16 = "blind send cell";
            uVar12 = 0xb55;
            goto LAB_0016f258;
          }
          uVar7 = ref_mpi_blindsend(local_1c0,find_ret,
                                    (void *)CONCAT44(find_donation._4_4_,(uint)find_donation),1,
                                    n_find,&lookedup_donation,&n_lookedup,1);
          if (uVar7 != 0) {
            uVar21 = (ulong)uVar7;
            pcVar16 = "blind send cell";
            uVar12 = 0xb59;
            goto LAB_0016f258;
          }
          for (lVar11 = 0; lVar11 < n_lookedup; lVar11 = lVar11 + 1) {
            donor_cell[lookedup_donation[lVar11]] = lookedup_cell[lVar11];
          }
          for (lVar11 = 0; local_1c4 = (int)lVar11, local_1c4 < ref_node->max; lVar11 = lVar11 + 1)
          {
            ref_node->part[lVar11] = local_e8[lVar11];
          }
          uVar7 = ref_migrate_shufflin(local_b0);
          if (uVar7 == 0) {
            uVar7 = ref_interp_reset(ref_interp);
            if (uVar7 == 0) {
              free(local_158);
              free(local_130);
              free(local_f0);
              free(local_128);
              uVar7 = ref_mpi_blindsend(local_1c0,donor_ret,donor_cell,1,n_donor,&recept_cell,
                                        (REF_INT *)&local_1b4,1);
              if (uVar7 != 0) {
                uVar21 = (ulong)uVar7;
                pcVar16 = "blind send cell";
                uVar12 = 0xb70;
                goto LAB_0016f258;
              }
              uVar7 = ref_mpi_blindsend(local_1c0,donor_ret,donor_global,1,n_donor,&recept_global,
                                        (REF_INT *)&local_1b4,2);
              if (uVar7 == 0) {
                uVar7 = ref_mpi_blindsend(local_1c0,donor_ret,local_180,1,n_donor,&recept_part,
                                          (REF_INT *)&local_1b4,1);
                if (uVar7 == 0) {
                  uVar7 = ref_mpi_blindsend(local_1c0,donor_ret,donor_bary,4,n_donor,&recept_bary,
                                            (REF_INT *)&local_1b4,3);
                  if (uVar7 == 0) {
                    lVar18 = 0;
                    for (lVar11 = 0; lVar11 < (int)local_1b4; lVar11 = lVar11 + 1) {
                      uVar7 = ref_node_local(ref_node,recept_global[lVar11],&local_1c4);
                      if (uVar7 != 0) {
                        uVar21 = (ulong)uVar7;
                        pcVar16 = "g2l";
                        uVar12 = 0xb7c;
                        goto LAB_0016f258;
                      }
                      ref_interp->cell[local_1c4] = recept_cell[lVar11];
                      ref_interp->part[local_1c4] = recept_part[lVar11];
                      pRVar4 = ref_interp->bary;
                      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
                        pRVar4[(local_1c4 << 2) + lVar13] =
                             *(REF_DBL *)((long)recept_bary + lVar13 * 8 + lVar18);
                      }
                      lVar18 = lVar18 + 0x20;
                    }
                    uVar7 = ref_search_free(ref_interp->ref_search);
                    if (uVar7 == 0) {
                      uVar7 = ref_interp_create_search(ref_interp);
                      if (uVar7 == 0) {
                        free(lookedup_donation);
                        free(lookedup_cell);
                        free(local_1a8);
                        free(find_ret);
                        free((void *)CONCAT44(find_donation._4_4_,(uint)find_donation));
                        free(find_nodes);
                        free(local_150);
                        free(local_180);
                        free(local_138);
                        free(local_148);
                        free(donor_bary);
                        free(donor_global);
                        free(donor_ret);
                        free(donor_cell);
                        free(recept_part);
                        free(local_f8);
                        free(recept_global);
                        free(recept_cell);
                        free(recept_bary);
                        free(vector);
                        return 0;
                      }
                      uVar21 = (ulong)uVar7;
                      pcVar16 = "(re)build search tree";
                      uVar12 = 0xb86;
                    }
                    else {
                      uVar21 = (ulong)uVar7;
                      pcVar16 = "free search tree";
                      uVar12 = 0xb85;
                    }
                  }
                  else {
                    uVar21 = (ulong)uVar7;
                    pcVar16 = "blind send cell";
                    uVar12 = 0xb79;
                  }
                }
                else {
                  uVar21 = (ulong)uVar7;
                  pcVar16 = "blind send cell";
                  uVar12 = 0xb76;
                }
              }
              else {
                uVar21 = (ulong)uVar7;
                pcVar16 = "blind send cell";
                uVar12 = 0xb73;
              }
            }
            else {
              uVar21 = (ulong)uVar7;
              pcVar16 = "ref_interp resize/reset";
              uVar12 = 0xb67;
            }
          }
          else {
            uVar21 = (ulong)uVar7;
            pcVar16 = "shufflin to grid";
            uVar12 = 0xb64;
          }
        }
        else {
          uVar21 = (ulong)uVar7;
          pcVar16 = "blind send cell";
          uVar12 = 0xb43;
        }
      }
      else {
        uVar21 = (ulong)uVar7;
        pcVar16 = "blind send cell";
        uVar12 = 0xb40;
      }
    }
    else {
      ref_cell_free(*local_1a0);
      ref_cell_free(*local_1a8);
      uVar7 = ref_shard_extract_tri(local_178,ppRVar10);
      if (uVar7 == 0) {
        uVar7 = ref_shard_extract_tet(local_178,local_1a8);
        if (uVar7 == 0) {
          ppRVar10 = local_1a0;
          if (local_178->twod == 0) {
            ppRVar10 = local_1a8;
          }
          local_198 = *ppRVar10;
          goto LAB_0016fed7;
        }
        uVar21 = (ulong)uVar7;
        pcVar16 = "shard tet";
        uVar12 = 0xb34;
      }
      else {
        uVar21 = (ulong)uVar7;
        pcVar16 = "shard tri";
        uVar12 = 0xb32;
      }
    }
  }
  else {
    uVar21 = (ulong)uVar7;
    pcVar16 = "shufflin from grid";
    uVar12 = 0xb2c;
  }
LAB_0016f258:
  uVar7 = (uint)uVar21;
LAB_0016f25b:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar12,
         "ref_interp_from_part",uVar21,pcVar16);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,
                                        REF_INT *to_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_INT node, i, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *from_part;
  REF_INT recept, n_recept, donation, n_donor;
  REF_INT find, n_find, lookedup, n_lookedup;
  REF_INT *donor_ret, *donor_cell, *donor_donation, *donor_part,
      *donor_origpart;
  REF_INT *recept_part, *recept_ret, *recept_cell;
  REF_GLOB *recept_global, *donor_global, *donor_nodes;
  REF_DBL *recept_bary, *donor_bary;
  REF_INT *find_ret, *find_donation, *find_cell;
  REF_GLOB *find_nodes;
  REF_INT *lookedup_donation, *lookedup_cell;
  REF_DBL max_error = -1.0;
  REF_BOOL report_migration_volume = REF_FALSE;
  REF_BOOL report_interp_error = REF_FALSE;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("starting %e max error\n", max_error);
    }
  }

  if (ref_node_max(to_node) > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  ref_malloc_init(from_part, ref_node_max(from_node), REF_INT, REF_EMPTY);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_global, n_recept, REF_GLOB);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_part, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_global[n_recept] = ref_node_global(to_node, node);
      recept_part[n_recept] = ref_interp->part[node];
      recept_ret[n_recept] = to_part[node];
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_global, 1,
                        n_recept, (void **)(&donor_global), &n_donor,
                        REF_GLOB_TYPE),
      "blind send global");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_malloc_init(donor_nodes, 4 * n_donor, REF_GLOB, REF_EMPTY);
  ref_malloc(donor_donation, n_donor, REF_INT);
  ref_malloc(donor_part, n_donor, REF_INT);
  ref_malloc(donor_origpart, n_donor, REF_INT);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      from_part[nodes[i]] = donor_ret[donation];
    }
  }
  RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");
  RSS(ref_interp_fill_empty_from_part(ref_interp, from_part), "fill part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      donor_nodes[i + 4 * donation] = ref_node_global(from_node, nodes[i]);
    }
    donor_donation[donation] = donation;
    RSS(ref_cell_part_cell_node(from_cell, from_node, donor_cell[donation],
                                &cell_node),
        "part cell_node");
    donor_part[donation] = from_part[nodes[cell_node]];
    donor_origpart[donation] = ref_mpi_rank(ref_mpi);
  }

  /* ensure parts of from_node are set */
  each_ref_node_valid_node(from_node, node) {
    RUS(REF_EMPTY, from_part[node], "from_part not set for node");
  }

  /* set parts of from_node */
  for (node = 0; node < ref_node_max(from_node); node++)
    ref_node_part(from_node, node) = from_part[node];

  /* shuffle from_node */
  RSS(ref_migrate_shufflin(from_grid), "shufflin from grid");

  if (ref_interp_from_cell_freeable(ref_interp)) {
    ref_cell_free(ref_interp_from_tri(ref_interp));
    ref_cell_free(ref_interp_from_tet(ref_interp));
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    if (ref_grid_twod(from_grid)) {
      from_cell = ref_interp_from_tri(ref_interp);
    } else {
      from_cell = ref_interp_from_tet(ref_interp);
    }
  }

  /* use new from part to translate nodes to cell (back and forth) */

  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_nodes, 4, n_donor,
                        (void **)(&find_nodes), &n_find, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_donation, 1, n_donor,
                        (void **)(&find_donation), &n_find, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_origpart, 1, n_donor,
                        (void **)(&find_ret), &n_find, REF_INT_TYPE),
      "blind send cell");

  ref_malloc(find_cell, n_find, REF_INT);

  for (find = 0; find < n_find; find++) {
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      RSS(ref_node_local(from_node, find_nodes[i + 4 * find], &(nodes[i])),
          "g2l");
    }
    RSS(ref_cell_with(from_cell, nodes, &(find_cell[find])),
        "find cell with nodes");
  }

  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_cell, 1, n_find,
                        (void **)(&lookedup_cell), &n_lookedup, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_donation, 1, n_find,
                        (void **)(&lookedup_donation), &n_lookedup,
                        REF_INT_TYPE),
      "blind send cell");

  for (lookedup = 0; lookedup < n_lookedup; lookedup++) {
    donor_cell[lookedup_donation[lookedup]] = lookedup_cell[lookedup];
  }

  /* shuffle to */
  for (node = 0; node < ref_node_max(to_node); node++) {
    ref_node_part(to_node, node) = to_part[node];
  }

  RSS(ref_migrate_shufflin(to_grid), "shufflin to grid");

  /* return from data to to grid and refill ref_interp->data */
  RSS(ref_interp_reset(ref_interp), "ref_interp resize/reset");

  ref_free(recept_part);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_cell, 1, n_donor,
                        (void **)(&recept_cell), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_global, 1, n_donor,
                        (void **)(&recept_global), &n_recept, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_part, 1, n_donor,
                        (void **)(&recept_part), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_bary, 4, n_donor,
                        (void **)(&recept_bary), &n_recept, REF_DBL_TYPE),
      "blind send cell");

  for (recept = 0; recept < n_recept; recept++) {
    RSS(ref_node_local(to_node, recept_global[recept], &node), "g2l");
    ref_interp->cell[node] = recept_cell[recept];
    ref_interp->part[node] = recept_part[recept];
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = recept_bary[i + 4 * recept];
    }
  }

  /* remake interp search tree */
  RSS(ref_search_free(ref_interp_search(ref_interp)), "free search tree");
  RSS(ref_interp_create_search(ref_interp), "(re)build search tree");

  ref_free(lookedup_donation);
  ref_free(lookedup_cell);

  ref_free(find_cell);
  ref_free(find_ret);
  ref_free(find_donation);
  ref_free(find_nodes);

  ref_free(donor_origpart);
  ref_free(donor_part);
  ref_free(donor_donation);
  ref_free(donor_nodes);
  ref_free(donor_bary);
  ref_free(donor_global);
  ref_free(donor_ret);
  ref_free(donor_cell);

  ref_free(recept_part);
  ref_free(recept_ret);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_free(from_part);

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("final %e max error\n", max_error);
    }
  }

  return REF_SUCCESS;
}